

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IEnumerableCore.hpp
# Opt level: O1

void __thiscall
linq::
IEnumerableCore<linq::GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_bool,_int>_>
::iterator::iterator
          (iterator *this,
          GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_bool,_int>
          *src,bool v)

{
  int *piVar1;
  
  (this->source).super_IState<linq::IGrouping<bool,_int_&>_>._vptr_IState =
       (_func_int **)&PTR_Init_00159648;
  (this->source).source.source.super_IState<int_&>._vptr_IState = (_func_int **)&PTR_Init_001581f8;
  std::vector<int,_std::allocator<int>_>::vector
            (&(this->source).source.source.source,&(src->source).source.source);
  piVar1 = (src->source).source.end._M_current;
  (this->source).source.source.current._M_current = (src->source).source.current._M_current;
  (this->source).source.source.end._M_current = piVar1;
  std::function<bool_(const_int_&)>::function(&(this->source).transformer,&src->transformer);
  std::
  _Rb_tree<bool,_std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>,_std::less<bool>,_std::allocator<std::pair<const_bool,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::_Rb_tree(&(this->source).result._M_t,&(src->result)._M_t);
  (this->source).current._M_node = (src->current)._M_node;
  this->valid = v;
  if (v) {
    GroupByState<linq::IEnumerableCore<linq::AdapterState<int_&,_std::vector<int,_std::allocator<int>_>_>_>,_bool,_int>
    ::Init(&this->source);
    this->valid = (_Rb_tree_header *)(this->source).current._M_node !=
                  &(this->source).result._M_t._M_impl.super__Rb_tree_header;
  }
  return;
}

Assistant:

iterator(S src, bool v = true) : source(src) {
				valid = v;
				
				if(v) { 
					source.Init();	
					valid = source.Valid();
				}
			}